

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# smb.c
# Opt level: O1

CURLcode smb_send_and_recv(connectdata *conn,void **msg)

{
  size_t *psVar1;
  int *piVar2;
  long lVar3;
  size_t sVar4;
  Curl_easy *pCVar5;
  curl_slist *pcVar6;
  uint uVar7;
  bool bVar8;
  unsigned_short uVar9;
  CURLcode CVar10;
  size_t in_RAX;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  size_t len;
  size_t nread;
  size_t local_28;
  
  local_28 = in_RAX;
  if (((conn->proto).ftpc.pp.response.tv_sec == 0) &&
     (uVar11 = (conn->proto).smbc.upload_size, uVar11 != 0)) {
    pCVar5 = conn->data;
    local_28 = (pCVar5->set).upload_buffer_size;
    if (uVar11 < local_28) {
      local_28 = uVar11;
    }
    (pCVar5->req).upload_fromhere = (pCVar5->state).ulbuf;
    CVar10 = Curl_fillreadbuffer(conn,local_28,&local_28);
    if ((CVar10 == CURLE_AGAIN) || (CVar10 == CURLE_OK)) {
      CVar10 = CURLE_OK;
      if (local_28 == 0) {
        bVar8 = false;
      }
      else {
        psVar1 = &(conn->proto).ftpc.pp.sendsize;
        *psVar1 = *psVar1 - local_28;
        (conn->proto).smbc.send_size = local_28;
        *(undefined8 *)&(conn->proto).ftpc.pp.response.tv_usec = 0;
        bVar8 = true;
      }
    }
    else {
      bVar8 = false;
    }
    if (!bVar8) {
      return CVar10;
    }
  }
  lVar3 = (conn->proto).ftpc.pp.response.tv_sec;
  if (lVar3 != 0) {
    sVar4 = (conn->proto).smbc.sent;
    len = lVar3 - sVar4;
    CVar10 = Curl_write(conn,0,(conn->data->state).ulbuf + sVar4,len,(ssize_t *)&local_28);
    if (CVar10 == CURLE_OK) {
      if (local_28 == len) {
        (conn->proto).ftpc.pp.response.tv_sec = 0;
      }
      else {
        piVar2 = &(conn->proto).ftpc.pp.response.tv_usec;
        *(size_t *)piVar2 = *(long *)piVar2 + local_28;
      }
      CVar10 = CURLE_OK;
    }
    if (CVar10 != CURLE_OK) {
      return CVar10;
    }
  }
  CVar10 = CURLE_AGAIN;
  if (((conn->proto).ftpc.pp.response.tv_sec == 0) && ((conn->proto).ftpc.pp.sendsize == 0)) {
    pcVar6 = (conn->proto).sshc.quote_item;
    sVar4 = (conn->proto).smbc.got;
    CVar10 = Curl_read(conn,0,(char *)((long)&pcVar6->data + sVar4),0x9000 - sVar4,
                       (ssize_t *)&local_28);
    if (CVar10 == CURLE_OK) {
      if ((local_28 != 0) &&
         (uVar11 = local_28 + (conn->proto).ftpc.pp.response_time,
         (conn->proto).ftpc.pp.response_time = uVar11, 3 < uVar11)) {
        uVar9 = Curl_read16_be((uchar *)((long)&pcVar6->data + 2));
        if ((ulong)uVar9 + 4 <= (ulong)(conn->proto).ftpc.pp.response_time) {
          if (0x20 < uVar9) {
            uVar7 = (uint)*(byte *)((long)&pcVar6[2].data + 4) * 2;
            uVar13 = uVar7 + 0x27;
            uVar12 = (uint)((ulong)uVar9 + 4);
            if ((uVar13 <= uVar12) &&
               (uVar9 = Curl_read16_le((uchar *)((long)&pcVar6[2].data + (ulong)uVar7 + 5)),
               uVar12 < uVar13 + uVar9)) {
              return CURLE_READ_ERROR;
            }
          }
          *msg = pcVar6;
        }
      }
      CVar10 = CURLE_OK;
    }
  }
  return CVar10;
}

Assistant:

static CURLcode smb_send_and_recv(struct connectdata *conn, void **msg)
{
  struct smb_conn *smbc = &conn->proto.smbc;
  CURLcode result;

  /* Check if there is data in the transfer buffer */
  if(!smbc->send_size && smbc->upload_size) {
    size_t nread = smbc->upload_size > conn->data->set.upload_buffer_size ?
      conn->data->set.upload_buffer_size :
      smbc->upload_size;
    conn->data->req.upload_fromhere = conn->data->state.ulbuf;
    result = Curl_fillreadbuffer(conn, nread, &nread);
    if(result && result != CURLE_AGAIN)
      return result;
    if(!nread)
      return CURLE_OK;

    smbc->upload_size -= nread;
    smbc->send_size = nread;
    smbc->sent = 0;
  }

  /* Check if there is data to send */
  if(smbc->send_size) {
    result = smb_flush(conn);
    if(result)
      return result;
  }

  /* Check if there is still data to be sent */
  if(smbc->send_size || smbc->upload_size)
    return CURLE_AGAIN;

  return smb_recv_message(conn, msg);
}